

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O2

bool __thiscall
QHstsHeaderParser::processDirective(QHstsHeaderParser *this,QByteArray *name,QByteArray *value)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  qlonglong qVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView a;
  QByteArrayView a_00;
  QByteArrayView local_48;
  bool ok;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = QByteArrayView::lengthHelperCharArray("max-age",8);
  a.m_data = "max-age";
  a.m_size = qVar3;
  iVar2 = QByteArray::compare(name,a,CaseInsensitive);
  if (iVar2 == 0) {
    if (this->maxAgeFound == false) {
      local_48.m_data = &DAT_aaaaaaaaaaaaaaaa;
      local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_30 = (value->d).ptr;
      _ok = (value->d).size;
      QVar5.m_data = local_30;
      QVar5.m_size = _ok;
      if (_ok < 2) {
LAB_0016d2a3:
        local_48 = QVar5;
        if (QVar5.m_size == 0) goto LAB_0016d2e7;
      }
      else {
        if (*local_30 == '\"') {
          QVar5 = QByteArrayView::mid((QByteArrayView *)&ok,1,_ok - 2);
          goto LAB_0016d2a3;
        }
        local_48.m_data = local_30;
        local_48.m_size = _ok;
      }
      _ok = _ok & 0xffffffffffffff00;
      qVar4 = QByteArrayView::toLongLong(&local_48,&ok,10);
      if ((-1 < qVar4) && (ok != false)) {
        this->maxAge = qVar4;
        this->maxAgeFound = true;
        bVar1 = true;
        goto LAB_0016d2e9;
      }
    }
  }
  else {
    qVar3 = QByteArrayView::lengthHelperCharArray("includesubdomains",0x12);
    a_00.m_data = "includesubdomains";
    a_00.m_size = qVar3;
    iVar2 = QByteArray::compare(name,a_00,CaseInsensitive);
    bVar1 = true;
    if (iVar2 != 0) goto LAB_0016d2e9;
    if (this->subDomainsFound == false) {
      this->subDomainsFound = true;
      goto LAB_0016d2e9;
    }
  }
LAB_0016d2e7:
  bVar1 = false;
LAB_0016d2e9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QHstsHeaderParser::processDirective(const QByteArray &name, const QByteArray &value)
{
    Q_ASSERT(name.size());
    // RFC6797 6.1/3 Directive names are case-insensitive
    if (name.compare("max-age", Qt::CaseInsensitive) == 0) {
        // RFC 6797, 6.1.1
        // The syntax of the max-age directive's REQUIRED value (after
        // quoted-string unescaping, if necessary) is defined as:
        //
        // max-age-value = delta-seconds
        if (maxAgeFound) {
            // RFC 6797, 6.1/2:
            // All directives MUST appear only once in an STS header field.
            return false;
        }

        const QByteArrayView unescapedValue = unescapeMaxAge(value);
        if (!unescapedValue.size())
            return false;

        bool ok = false;
        const qint64 age = unescapedValue.toLongLong(&ok);
        if (!ok || age < 0)
            return false;

        maxAge = age;
        maxAgeFound = true;
    } else if (name.compare("includesubdomains", Qt::CaseInsensitive) == 0) {
        // RFC 6797, 6.1.2.  The includeSubDomains Directive.
        // The OPTIONAL "includeSubDomains" directive is a valueless directive.

        if (subDomainsFound) {
            // RFC 6797, 6.1/2:
            // All directives MUST appear only once in an STS header field.
            return false;
        }

        subDomainsFound = true;
    } // else we do nothing, skip unknown directives (RFC 6797, 6.1/5)

    return true;
}